

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaDeriveAndValidateFacets(xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr type)

{
  xmlSchemaTypePtr pxVar1;
  xmlSchemaFacetPtr pxVar2;
  xmlNodePtr pxVar3;
  int iVar4;
  xmlSchemaFacetLinkPtr pxVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  xmlSchemaFacetPtr pxVar8;
  xmlSchemaFacetLinkPtr pxVar9;
  xmlSchemaFacetPtr facet2;
  xmlSchemaFacetPtr pxVar10;
  xmlSchemaFacetLinkPtr *ppxVar11;
  char *str2;
  xmlSchemaFacetPtr pxVar12;
  xmlSchemaFacetPtr facet1;
  xmlSchemaFacetPtr facet1_00;
  xmlSchemaFacetPtr facet1_01;
  _xmlSchemaFacetLink *p_Var13;
  xmlSchemaFacetLinkPtr pxVar14;
  xmlSchemaFacetPtr facet2_00;
  xmlSchemaFacetPtr facet2_01;
  xmlSchemaFacetPtr local_c8;
  xmlSchemaFacetPtr local_c0;
  xmlSchemaFacetPtr local_a0;
  xmlSchemaFacetPtr local_98;
  xmlSchemaFacetPtr local_90;
  xmlSchemaFacetPtr local_80;
  xmlSchemaFacetPtr local_70;
  xmlSchemaFacetPtr local_60;
  xmlSchemaFacetPtr local_58;
  
  pxVar1 = type->baseType;
  pxVar5 = type->facetSet;
  if (type->facetSet == (xmlSchemaFacetLinkPtr)0x0) {
    if (pxVar1->facetSet == (xmlSchemaFacetLinkPtr)0x0) {
      return 0;
    }
    pxVar14 = (xmlSchemaFacetLinkPtr)0x0;
  }
  else {
    do {
      pxVar14 = pxVar5;
      pxVar5 = pxVar14->next;
    } while (pxVar14->next != (_xmlSchemaFacetLink *)0x0);
  }
  ppxVar11 = &type->facetSet;
  pxVar5 = *ppxVar11;
  if (pxVar5 == (xmlSchemaFacetLinkPtr)0x0) {
    local_90 = (xmlSchemaFacetPtr)0x0;
    facet1 = (xmlSchemaFacetPtr)0x0;
    pxVar12 = (xmlSchemaFacetPtr)0x0;
    pxVar10 = (xmlSchemaFacetPtr)0x0;
    local_60 = (xmlSchemaFacetPtr)0x0;
    facet2_00 = (xmlSchemaFacetPtr)0x0;
    facet1_01 = (xmlSchemaFacetPtr)0x0;
    facet2_01 = (xmlSchemaFacetPtr)0x0;
    facet1_00 = (xmlSchemaFacetPtr)0x0;
  }
  else {
    facet1_00 = (xmlSchemaFacetPtr)0x0;
    facet2_01 = (xmlSchemaFacetPtr)0x0;
    facet1_01 = (xmlSchemaFacetPtr)0x0;
    facet2_00 = (xmlSchemaFacetPtr)0x0;
    local_60 = (xmlSchemaFacetPtr)0x0;
    pxVar10 = (xmlSchemaFacetPtr)0x0;
    pxVar12 = (xmlSchemaFacetPtr)0x0;
    facet1 = (xmlSchemaFacetPtr)0x0;
    local_90 = (xmlSchemaFacetPtr)0x0;
    do {
      pxVar8 = pxVar5->facet;
      switch(pxVar8->type) {
      case XML_SCHEMA_FACET_MININCLUSIVE:
        facet2_00 = pxVar8;
        break;
      case XML_SCHEMA_FACET_MINEXCLUSIVE:
        facet2_01 = pxVar8;
        break;
      case XML_SCHEMA_FACET_MAXINCLUSIVE:
        facet1_01 = pxVar8;
        break;
      case XML_SCHEMA_FACET_MAXEXCLUSIVE:
        facet1_00 = pxVar8;
        break;
      case XML_SCHEMA_FACET_TOTALDIGITS:
        facet1 = pxVar8;
        break;
      case XML_SCHEMA_FACET_FRACTIONDIGITS:
        pxVar12 = pxVar8;
        break;
      case XML_SCHEMA_FACET_LENGTH:
        local_90 = pxVar8;
        break;
      case XML_SCHEMA_FACET_MAXLENGTH:
        pxVar10 = pxVar8;
        break;
      case XML_SCHEMA_FACET_MINLENGTH:
        local_60 = pxVar8;
      }
      pxVar5 = pxVar5->next;
    } while (pxVar5 != (_xmlSchemaFacetLink *)0x0);
  }
  pxVar5 = pxVar1->facetSet;
  if (pxVar5 == (xmlSchemaFacetLinkPtr)0x0) {
    local_70 = (xmlSchemaFacetPtr)0x0;
    pxVar8 = (xmlSchemaFacetPtr)0x0;
    local_58 = (xmlSchemaFacetPtr)0x0;
    local_80 = (xmlSchemaFacetPtr)0x0;
    facet2 = (xmlSchemaFacetPtr)0x0;
    local_a0 = (xmlSchemaFacetPtr)0x0;
    local_98 = (xmlSchemaFacetPtr)0x0;
    local_c0 = (xmlSchemaFacetPtr)0x0;
    local_c8 = (xmlSchemaFacetPtr)0x0;
  }
  else {
    local_c8 = (xmlSchemaFacetPtr)0x0;
    local_c0 = (xmlSchemaFacetPtr)0x0;
    local_98 = (xmlSchemaFacetPtr)0x0;
    local_a0 = (xmlSchemaFacetPtr)0x0;
    facet2 = (xmlSchemaFacetPtr)0x0;
    local_80 = (xmlSchemaFacetPtr)0x0;
    local_58 = (xmlSchemaFacetPtr)0x0;
    pxVar8 = (xmlSchemaFacetPtr)0x0;
    local_70 = (xmlSchemaFacetPtr)0x0;
    do {
      pxVar2 = pxVar5->facet;
      switch(pxVar2->type) {
      case XML_SCHEMA_FACET_MININCLUSIVE:
        local_a0 = pxVar2;
        break;
      case XML_SCHEMA_FACET_MINEXCLUSIVE:
        local_c0 = pxVar2;
        break;
      case XML_SCHEMA_FACET_MAXINCLUSIVE:
        local_98 = pxVar2;
        break;
      case XML_SCHEMA_FACET_MAXEXCLUSIVE:
        local_c8 = pxVar2;
        break;
      case XML_SCHEMA_FACET_TOTALDIGITS:
        pxVar8 = pxVar2;
        break;
      case XML_SCHEMA_FACET_FRACTIONDIGITS:
        local_58 = pxVar2;
        break;
      case XML_SCHEMA_FACET_LENGTH:
        local_70 = pxVar2;
        break;
      case XML_SCHEMA_FACET_MAXLENGTH:
        local_80 = pxVar2;
        break;
      case XML_SCHEMA_FACET_MINLENGTH:
        facet2 = pxVar2;
      }
      pxVar5 = pxVar5->next;
    } while (pxVar5 != (_xmlSchemaFacetLink *)0x0);
  }
  str2 = (char *)facet2;
  if ((local_90 != (xmlSchemaFacetPtr)0x0) &&
     (local_60 != (xmlSchemaFacetPtr)0x0 || pxVar10 != (xmlSchemaFacetPtr)0x0)) {
    str2 = 
    "It is an error for both \'length\' and either of \'minLength\' or \'maxLength\' to be specified on the same type definition"
    ;
    xmlSchemaPCustomErrExt
              (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)local_90,local_90->node,
               "It is an error for both \'length\' and either of \'minLength\' or \'maxLength\' to be specified on the same type definition"
               ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
  }
  if (facet1_00 != (xmlSchemaFacetPtr)0x0 && facet1_01 != (xmlSchemaFacetPtr)0x0) {
    pxVar3 = facet1_01->node;
    pxVar6 = xmlSchemaFacetTypeToString(facet1_01->type);
    pxVar7 = xmlSchemaFacetTypeToString(facet1_00->type);
    str2 = "It is an error for both \'%s\' and \'%s\' to be specified on the same type definition";
    xmlSchemaPCustomErrExt
              (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)facet1_01,pxVar3,
               "It is an error for both \'%s\' and \'%s\' to be specified on the same type definition"
               ,pxVar6,pxVar7,(xmlChar *)0x0);
  }
  if (facet2_01 != (xmlSchemaFacetPtr)0x0 && facet2_00 != (xmlSchemaFacetPtr)0x0) {
    pxVar3 = facet2_00->node;
    pxVar6 = xmlSchemaFacetTypeToString(facet2_00->type);
    pxVar7 = xmlSchemaFacetTypeToString(facet2_01->type);
    str2 = "It is an error for both \'%s\' and \'%s\' to be specified on the same type definition";
    xmlSchemaPCustomErrExt
              (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)facet2_00,pxVar3,
               "It is an error for both \'%s\' and \'%s\' to be specified on the same type definition"
               ,pxVar6,pxVar7,(xmlChar *)0x0);
  }
  if ((local_90 != (xmlSchemaFacetPtr)0x0) && (local_70 != (xmlSchemaFacetPtr)0x0)) {
    iVar4 = xmlSchemaCompareValues(local_90->val,local_70->val);
    if (iVar4 == -2) goto LAB_001c11c2;
    if (iVar4 != 0) {
      str2 = (char *)0x0;
      xmlSchemaDeriveFacetErr(pctxt,local_90,local_70,0,0,1);
      if (local_70->fixed != 0) {
        str2 = "The base type\'s facet is \'fixed\', thus the value must not differ";
        xmlSchemaPCustomErrExt
                  (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)local_90,
                   local_90->node,
                   "The base type\'s facet is \'fixed\', thus the value must not differ",
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      }
    }
  }
  if ((local_60 != (xmlSchemaFacetPtr)0x0) && (facet2 != (xmlSchemaFacetPtr)0x0)) {
    iVar4 = xmlSchemaCompareValues(local_60->val,facet2->val);
    if (iVar4 == -2) goto LAB_001c11c2;
    if (iVar4 != 0) {
      if (iVar4 == -1) {
        str2 = &DAT_00000001;
        xmlSchemaDeriveFacetErr(pctxt,local_60,facet2,1,1,1);
      }
      if (facet2->fixed != 0) {
        str2 = "The base type\'s facet is \'fixed\', thus the value must not differ";
        xmlSchemaPCustomErrExt
                  (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)local_60,
                   local_60->node,
                   "The base type\'s facet is \'fixed\', thus the value must not differ",
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      }
    }
  }
  if ((pxVar10 != (xmlSchemaFacetPtr)0x0) && (local_80 != (xmlSchemaFacetPtr)0x0)) {
    iVar4 = xmlSchemaCompareValues(pxVar10->val,local_80->val);
    if (iVar4 == -2) goto LAB_001c11c2;
    if (iVar4 != 0) {
      if (iVar4 == 1) {
        str2 = &DAT_00000001;
        xmlSchemaDeriveFacetErr(pctxt,pxVar10,local_80,-1,1,1);
      }
      if (local_80->fixed != 0) {
        str2 = "The base type\'s facet is \'fixed\', thus the value must not differ";
        xmlSchemaPCustomErrExt
                  (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)pxVar10,
                   pxVar10->node,
                   "The base type\'s facet is \'fixed\', thus the value must not differ",
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      }
    }
  }
  if (local_90 != (xmlSchemaFacetPtr)0x0) {
    local_70 = local_90;
  }
  if (local_70 != (xmlSchemaFacetPtr)0x0) {
    if (local_60 != (xmlSchemaFacetPtr)0x0) {
      facet2 = local_60;
    }
    if (facet2 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(local_70->val,facet2->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 == -1) {
        str2 = &DAT_00000001;
        xmlSchemaDeriveFacetErr(pctxt,local_70,facet2,1,1,0);
      }
    }
    if (pxVar10 != (xmlSchemaFacetPtr)0x0) {
      local_80 = pxVar10;
    }
    if (local_80 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(local_70->val,local_80->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 == 1) {
        str2 = &DAT_00000001;
        xmlSchemaDeriveFacetErr(pctxt,local_70,local_80,-1,1,0);
      }
    }
  }
  if (facet1_01 != (xmlSchemaFacetPtr)0x0) {
    if (facet2_00 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet1_01->val,facet2_00->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 == -1) {
        str2 = &DAT_00000001;
        xmlSchemaDeriveFacetErr(pctxt,facet1_01,facet2_00,1,1,0);
      }
    }
    if (local_98 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet1_01->val,local_98->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 != 0) {
        if (iVar4 == 1) {
          str2 = &DAT_00000001;
          xmlSchemaDeriveFacetErr(pctxt,facet1_01,local_98,-1,1,1);
        }
        if (local_98->fixed != 0) {
          str2 = "The base type\'s facet is \'fixed\', thus the value must not differ";
          xmlSchemaPCustomErrExt
                    (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)facet1_01,
                     facet1_01->node,
                     "The base type\'s facet is \'fixed\', thus the value must not differ",
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
        }
      }
    }
    if (local_c8 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet1_01->val,local_c8->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 != -1) {
        str2 = (char *)0x0;
        xmlSchemaDeriveFacetErr(pctxt,facet1_01,local_c8,-1,0,1);
      }
    }
    if (local_a0 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet1_01->val,local_a0->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 == -1) {
        str2 = &DAT_00000001;
        xmlSchemaDeriveFacetErr(pctxt,facet1_01,local_a0,1,1,1);
      }
    }
    if (local_c0 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet1_01->val,local_c0->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 != 1) {
        str2 = (char *)0x0;
        xmlSchemaDeriveFacetErr(pctxt,facet1_01,local_c0,1,0,1);
      }
    }
  }
  if (facet1_00 != (xmlSchemaFacetPtr)0x0) {
    if (facet2_01 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet1_00->val,facet2_01->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 == -1) {
        str2 = &DAT_00000001;
        xmlSchemaDeriveFacetErr(pctxt,facet1_00,facet2_01,1,1,0);
      }
    }
    if (local_c8 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet1_00->val,local_c8->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 != 0) {
        if (iVar4 == 1) {
          str2 = &DAT_00000001;
          xmlSchemaDeriveFacetErr(pctxt,facet1_00,local_c8,-1,1,1);
        }
        if (local_c8->fixed != 0) {
          str2 = "The base type\'s facet is \'fixed\', thus the value must not differ";
          xmlSchemaPCustomErrExt
                    (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)facet1_00,
                     facet1_00->node,
                     "The base type\'s facet is \'fixed\', thus the value must not differ",
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
        }
      }
    }
    if (local_98 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet1_00->val,local_98->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 == 1) {
        str2 = &DAT_00000001;
        xmlSchemaDeriveFacetErr(pctxt,facet1_00,local_98,-1,1,1);
      }
    }
    if (local_a0 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet1_00->val,local_a0->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 != 1) {
        str2 = (char *)0x0;
        xmlSchemaDeriveFacetErr(pctxt,facet1_00,local_a0,1,0,1);
      }
    }
    if (local_c0 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet1_00->val,local_c0->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 != 1) {
        str2 = (char *)0x0;
        xmlSchemaDeriveFacetErr(pctxt,facet1_00,local_c0,1,0,1);
      }
    }
  }
  if (facet2_01 != (xmlSchemaFacetPtr)0x0) {
    if (facet1_01 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet2_01->val,facet1_01->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 != -1) {
        str2 = (char *)0x0;
        xmlSchemaDeriveFacetErr(pctxt,facet2_01,facet1_01,-1,0,0);
      }
    }
    if (local_c0 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet2_01->val,local_c0->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 != 0) {
        if (iVar4 == -1) {
          str2 = &DAT_00000001;
          xmlSchemaDeriveFacetErr(pctxt,facet2_01,local_c0,1,1,1);
        }
        if (local_c0->fixed != 0) {
          str2 = "The base type\'s facet is \'fixed\', thus the value must not differ";
          xmlSchemaPCustomErrExt
                    (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)facet2_01,
                     facet2_01->node,
                     "The base type\'s facet is \'fixed\', thus the value must not differ",
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
        }
      }
    }
    if (local_98 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet2_01->val,local_98->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 == 1) {
        str2 = &DAT_00000001;
        xmlSchemaDeriveFacetErr(pctxt,facet2_01,local_98,-1,1,1);
      }
    }
    if (local_a0 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet2_01->val,local_a0->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 == -1) {
        str2 = &DAT_00000001;
        xmlSchemaDeriveFacetErr(pctxt,facet2_01,local_a0,1,1,1);
      }
    }
    if (local_c8 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet2_01->val,local_c8->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 != -1) {
        str2 = (char *)0x0;
        xmlSchemaDeriveFacetErr(pctxt,facet2_01,local_c8,-1,0,1);
      }
    }
  }
  if (facet2_00 != (xmlSchemaFacetPtr)0x0) {
    if (facet1_00 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet2_00->val,facet1_00->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 != -1) {
        str2 = (char *)0x0;
        xmlSchemaDeriveFacetErr(pctxt,facet2_00,facet1_00,-1,0,0);
      }
    }
    if (local_a0 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet2_00->val,local_a0->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 != 0) {
        if (iVar4 == -1) {
          str2 = &DAT_00000001;
          xmlSchemaDeriveFacetErr(pctxt,facet2_00,local_a0,1,1,1);
        }
        if (local_a0->fixed != 0) {
          str2 = "The base type\'s facet is \'fixed\', thus the value must not differ";
          xmlSchemaPCustomErrExt
                    (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)facet2_00,
                     facet2_00->node,
                     "The base type\'s facet is \'fixed\', thus the value must not differ",
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
        }
      }
    }
    if (local_98 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet2_00->val,local_98->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 == 1) {
        str2 = &DAT_00000001;
        xmlSchemaDeriveFacetErr(pctxt,facet2_00,local_98,-1,1,1);
      }
    }
    if (local_c0 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet2_00->val,local_c0->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 != 1) {
        str2 = (char *)0x0;
        xmlSchemaDeriveFacetErr(pctxt,facet2_00,local_c0,1,0,1);
      }
    }
    if (local_c8 != (xmlSchemaFacetPtr)0x0) {
      iVar4 = xmlSchemaCompareValues(facet2_00->val,local_c8->val);
      if (iVar4 == -2) goto LAB_001c11c2;
      if (iVar4 != -1) {
        str2 = (char *)0x0;
        xmlSchemaDeriveFacetErr(pctxt,facet2_00,local_c8,-1,0,1);
      }
    }
  }
  if ((facet1 != (xmlSchemaFacetPtr)0x0) && (pxVar8 != (xmlSchemaFacetPtr)0x0)) {
    iVar4 = xmlSchemaCompareValues(facet1->val,pxVar8->val);
    if (iVar4 == -2) goto LAB_001c11c2;
    if (iVar4 != 0) {
      if (iVar4 == 1) {
        str2 = &DAT_00000001;
        xmlSchemaDeriveFacetErr(pctxt,facet1,pxVar8,-1,1,1);
      }
      if (pxVar8->fixed != 0) {
        str2 = "The base type\'s facet is \'fixed\', thus the value must not differ";
        xmlSchemaPCustomErrExt
                  (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)facet1,facet1->node,
                   "The base type\'s facet is \'fixed\', thus the value must not differ",
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      }
    }
  }
  if ((pxVar12 != (xmlSchemaFacetPtr)0x0) && (local_58 != (xmlSchemaFacetPtr)0x0)) {
    iVar4 = xmlSchemaCompareValues(pxVar12->val,local_58->val);
    if (iVar4 == -2) goto LAB_001c11c2;
    if (iVar4 != 0) {
      if (iVar4 == 1) {
        str2 = &DAT_00000001;
        xmlSchemaDeriveFacetErr(pctxt,pxVar12,local_58,-1,1,1);
      }
      if (local_58->fixed != 0) {
        str2 = "The base type\'s facet is \'fixed\', thus the value must not differ";
        xmlSchemaPCustomErrExt
                  (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)pxVar12,
                   pxVar12->node,
                   "The base type\'s facet is \'fixed\', thus the value must not differ",
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      }
    }
  }
  if (facet1 != (xmlSchemaFacetPtr)0x0) {
    pxVar8 = facet1;
  }
  if (pxVar12 != (xmlSchemaFacetPtr)0x0) {
    local_58 = pxVar12;
  }
  if ((pxVar8 != (xmlSchemaFacetPtr)0x0) && (local_58 != (xmlSchemaFacetPtr)0x0)) {
    iVar4 = xmlSchemaCompareValues(local_58->val,pxVar8->val);
    if (iVar4 == -2) {
LAB_001c11c2:
      xmlSchemaInternalErr2
                ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaDeriveAndValidateFacets",
                 "an error occurred",(xmlChar *)0x0,(xmlChar *)str2);
      return -1;
    }
    if (iVar4 == 1) {
      xmlSchemaDeriveFacetErr(pctxt,local_58,pxVar8,-1,1,0);
    }
  }
  p_Var13 = pxVar1->facetSet;
  if (p_Var13 == (xmlSchemaFacetLinkPtr)0x0) {
    return 0;
  }
  do {
    pxVar10 = p_Var13->facet;
    pxVar5 = (xmlSchemaFacetLinkPtr)ppxVar11;
    pxVar9 = pxVar14;
    if ((pxVar10->type & ~XML_SCHEMA_TYPE_BASIC) != XML_SCHEMA_FACET_PATTERN) {
      do {
        pxVar5 = pxVar5->next;
        if (pxVar5 == (xmlSchemaFacetLinkPtr)0x0) {
          pxVar9 = (xmlSchemaFacetLinkPtr)(*xmlMalloc)(0x10);
          if (pxVar9 == (xmlSchemaFacetLinkPtr)0x0) {
            if (pctxt != (xmlSchemaParserCtxtPtr)0x0) {
              pctxt->nberrors = pctxt->nberrors + 1;
            }
            __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,
                             "deriving facets, creating a facet link");
            return -1;
          }
          pxVar9->facet = p_Var13->facet;
          pxVar9->next = (_xmlSchemaFacetLink *)0x0;
          if (pxVar14 == (xmlSchemaFacetLinkPtr)0x0) {
            *ppxVar11 = pxVar9;
          }
          else {
            pxVar14->next = pxVar9;
          }
          goto LAB_001c11b1;
        }
        pxVar12 = pxVar5->facet;
      } while (pxVar12->type != pxVar10->type);
      if (pxVar12->type == XML_SCHEMA_FACET_WHITESPACE) {
        if (pxVar12->whitespace < pxVar10->whitespace) {
          xmlSchemaPCustomErrExt
                    (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)pxVar12,
                     pxVar12->node,
                     "The \'whitespace\' value has to be equal to or stronger than the \'whitespace\' value of the base type"
                     ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
        }
        if ((pxVar10->fixed != 0) && (pxVar12->whitespace != pxVar10->whitespace)) {
          xmlSchemaPCustomErrExt
                    (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)pxVar12,
                     pxVar12->node,
                     "The base type\'s facet is \'fixed\', thus the value must not differ",
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
        }
      }
    }
LAB_001c11b1:
    p_Var13 = p_Var13->next;
    pxVar14 = pxVar9;
    if (p_Var13 == (_xmlSchemaFacetLink *)0x0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
xmlSchemaDeriveAndValidateFacets(xmlSchemaParserCtxtPtr pctxt,
				 xmlSchemaTypePtr type)
{
    xmlSchemaTypePtr base = type->baseType;
    xmlSchemaFacetLinkPtr link, cur, last = NULL;
    xmlSchemaFacetPtr facet, bfacet,
	flength = NULL, ftotdig = NULL, ffracdig = NULL,
	fmaxlen = NULL, fminlen = NULL, /* facets of the current type */
	fmininc = NULL, fmaxinc = NULL,
	fminexc = NULL, fmaxexc = NULL,
	bflength = NULL, bftotdig = NULL, bffracdig = NULL,
	bfmaxlen = NULL, bfminlen = NULL, /* facets of the base type */
	bfmininc = NULL, bfmaxinc = NULL,
	bfminexc = NULL, bfmaxexc = NULL;
    int res; /* err = 0, fixedErr; */

    /*
    * SPEC st-restrict-facets 1:
    * "The {variety} of R is the same as that of B."
    */
    /*
    * SPEC st-restrict-facets 2:
    * "If {variety} is atomic, the {primitive type definition}
    * of R is the same as that of B."
    *
    * NOTE: we leave 1 & 2 out for now, since this will be
    * satisfied by the derivation process.
    * CONSTRUCTION TODO: Maybe needed if using a construction API.
    */
    /*
    * SPEC st-restrict-facets 3:
    * "The {facets} of R are the union of S and the {facets}
    * of B, eliminating duplicates. To eliminate duplicates,
    * when a facet of the same kind occurs in both S and the
    * {facets} of B, the one in the {facets} of B is not
    * included, with the exception of enumeration and pattern
    * facets, for which multiple occurrences with distinct values
    * are allowed."
    */

    if ((type->facetSet == NULL) && (base->facetSet == NULL))
	return (0);

    last = type->facetSet;
    if (last != NULL)
	while (last->next != NULL)
	    last = last->next;

    for (cur = type->facetSet; cur != NULL; cur = cur->next) {
	facet = cur->facet;
	switch (facet->type) {
	    case XML_SCHEMA_FACET_LENGTH:
		flength = facet; break;
	    case XML_SCHEMA_FACET_MINLENGTH:
		fminlen = facet; break;
	    case XML_SCHEMA_FACET_MININCLUSIVE:
		fmininc = facet; break;
	    case XML_SCHEMA_FACET_MINEXCLUSIVE:
		fminexc = facet; break;
	    case XML_SCHEMA_FACET_MAXLENGTH:
		fmaxlen = facet; break;
	    case XML_SCHEMA_FACET_MAXINCLUSIVE:
		fmaxinc = facet; break;
	    case XML_SCHEMA_FACET_MAXEXCLUSIVE:
		fmaxexc = facet; break;
	    case XML_SCHEMA_FACET_TOTALDIGITS:
		ftotdig = facet; break;
	    case XML_SCHEMA_FACET_FRACTIONDIGITS:
		ffracdig = facet; break;
	    default:
		break;
	}
    }
    for (cur = base->facetSet; cur != NULL; cur = cur->next) {
	facet = cur->facet;
	switch (facet->type) {
	    case XML_SCHEMA_FACET_LENGTH:
		bflength = facet; break;
	    case XML_SCHEMA_FACET_MINLENGTH:
		bfminlen = facet; break;
	    case XML_SCHEMA_FACET_MININCLUSIVE:
		bfmininc = facet; break;
	    case XML_SCHEMA_FACET_MINEXCLUSIVE:
		bfminexc = facet; break;
	    case XML_SCHEMA_FACET_MAXLENGTH:
		bfmaxlen = facet; break;
	    case XML_SCHEMA_FACET_MAXINCLUSIVE:
		bfmaxinc = facet; break;
	    case XML_SCHEMA_FACET_MAXEXCLUSIVE:
		bfmaxexc = facet; break;
	    case XML_SCHEMA_FACET_TOTALDIGITS:
		bftotdig = facet; break;
	    case XML_SCHEMA_FACET_FRACTIONDIGITS:
		bffracdig = facet; break;
	    default:
		break;
	}
    }
    /*
    * length and minLength or maxLength (2.2) + (3.2)
    */
    if (flength && (fminlen || fmaxlen)) {
	FACET_RESTR_ERR(flength, "It is an error for both 'length' and "
	    "either of 'minLength' or 'maxLength' to be specified on "
	    "the same type definition")
    }
    /*
    * Mutual exclusions in the same derivation step.
    */
    if ((fmaxinc) && (fmaxexc)) {
	/*
	* SCC "maxInclusive and maxExclusive"
	*/
	FACET_RESTR_MUTUAL_ERR(fmaxinc, fmaxexc)
    }
    if ((fmininc) && (fminexc)) {
	/*
	* SCC "minInclusive and minExclusive"
	*/
	FACET_RESTR_MUTUAL_ERR(fmininc, fminexc)
    }

    if (flength && bflength) {
	/*
	* SCC "length valid restriction"
	* The values have to be equal.
	*/
	res = xmlSchemaCompareValues(flength->val, bflength->val);
	if (res == -2)
	    goto internal_error;
	if (res != 0)
	    xmlSchemaDeriveFacetErr(pctxt, flength, bflength, 0, 0, 1);
	if ((res != 0) && (bflength->fixed)) {
	    FACET_RESTR_FIXED_ERR(flength)
	}

    }
    if (fminlen && bfminlen) {
	/*
	* SCC "minLength valid restriction"
	* minLength >= BASE minLength
	*/
	res = xmlSchemaCompareValues(fminlen->val, bfminlen->val);
	if (res == -2)
	    goto internal_error;
	if (res == -1)
	    xmlSchemaDeriveFacetErr(pctxt, fminlen, bfminlen, 1, 1, 1);
	if ((res != 0) && (bfminlen->fixed)) {
	    FACET_RESTR_FIXED_ERR(fminlen)
	}
    }
    if (fmaxlen && bfmaxlen) {
	/*
	* SCC "maxLength valid restriction"
	* maxLength <= BASE minLength
	*/
	res = xmlSchemaCompareValues(fmaxlen->val, bfmaxlen->val);
	if (res == -2)
	    goto internal_error;
	if (res == 1)
	    xmlSchemaDeriveFacetErr(pctxt, fmaxlen, bfmaxlen, -1, 1, 1);
	if ((res != 0) && (bfmaxlen->fixed)) {
	    FACET_RESTR_FIXED_ERR(fmaxlen)
	}
    }
    /*
    * SCC "length and minLength or maxLength"
    */
    if (! flength)
	flength = bflength;
    if (flength) {
	if (! fminlen)
	    fminlen = bfminlen;
	if (fminlen) {
	    /* (1.1) length >= minLength */
	    res = xmlSchemaCompareValues(flength->val, fminlen->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1)
		xmlSchemaDeriveFacetErr(pctxt, flength, fminlen, 1, 1, 0);
	}
	if (! fmaxlen)
	    fmaxlen = bfmaxlen;
	if (fmaxlen) {
	    /* (2.1) length <= maxLength */
	    res = xmlSchemaCompareValues(flength->val, fmaxlen->val);
	    if (res == -2)
		goto internal_error;
	    if (res == 1)
		xmlSchemaDeriveFacetErr(pctxt, flength, fmaxlen, -1, 1, 0);
	}
    }
    if (fmaxinc) {
	/*
	* "maxInclusive"
	*/
	if (fmininc) {
	    /* SCC "maxInclusive >= minInclusive" */
	    res = xmlSchemaCompareValues(fmaxinc->val, fmininc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxinc, fmininc, 1, 1, 0);
	    }
	}
	/*
	* SCC "maxInclusive valid restriction"
	*/
	if (bfmaxinc) {
	    /* maxInclusive <= BASE maxInclusive */
	    res = xmlSchemaCompareValues(fmaxinc->val, bfmaxinc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == 1)
		xmlSchemaDeriveFacetErr(pctxt, fmaxinc, bfmaxinc, -1, 1, 1);
	    if ((res != 0) && (bfmaxinc->fixed)) {
		FACET_RESTR_FIXED_ERR(fmaxinc)
	    }
	}
	if (bfmaxexc) {
	    /* maxInclusive < BASE maxExclusive */
	    res = xmlSchemaCompareValues(fmaxinc->val, bfmaxexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != -1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxinc, bfmaxexc, -1, 0, 1);
	    }
	}
	if (bfmininc) {
	    /* maxInclusive >= BASE minInclusive */
	    res = xmlSchemaCompareValues(fmaxinc->val, bfmininc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxinc, bfmininc, 1, 1, 1);
	    }
	}
	if (bfminexc) {
	    /* maxInclusive > BASE minExclusive */
	    res = xmlSchemaCompareValues(fmaxinc->val, bfminexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != 1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxinc, bfminexc, 1, 0, 1);
	    }
	}
    }
    if (fmaxexc) {
	/*
	* "maxExclusive >= minExclusive"
	*/
	if (fminexc) {
	    res = xmlSchemaCompareValues(fmaxexc->val, fminexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxexc, fminexc, 1, 1, 0);
	    }
	}
	/*
	* "maxExclusive valid restriction"
	*/
	if (bfmaxexc) {
	    /* maxExclusive <= BASE maxExclusive */
	    res = xmlSchemaCompareValues(fmaxexc->val, bfmaxexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == 1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxexc, bfmaxexc, -1, 1, 1);
	    }
	    if ((res != 0) && (bfmaxexc->fixed)) {
		FACET_RESTR_FIXED_ERR(fmaxexc)
	    }
	}
	if (bfmaxinc) {
	    /* maxExclusive <= BASE maxInclusive */
	    res = xmlSchemaCompareValues(fmaxexc->val, bfmaxinc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == 1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxexc, bfmaxinc, -1, 1, 1);
	    }
	}
	if (bfmininc) {
	    /* maxExclusive > BASE minInclusive */
	    res = xmlSchemaCompareValues(fmaxexc->val, bfmininc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != 1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxexc, bfmininc, 1, 0, 1);
	    }
	}
	if (bfminexc) {
	    /* maxExclusive > BASE minExclusive */
	    res = xmlSchemaCompareValues(fmaxexc->val, bfminexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != 1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxexc, bfminexc, 1, 0, 1);
	    }
	}
    }
    if (fminexc) {
	/*
	* "minExclusive < maxInclusive"
	*/
	if (fmaxinc) {
	    res = xmlSchemaCompareValues(fminexc->val, fmaxinc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != -1) {
		xmlSchemaDeriveFacetErr(pctxt, fminexc, fmaxinc, -1, 0, 0);
	    }
	}
	/*
	* "minExclusive valid restriction"
	*/
	if (bfminexc) {
	    /* minExclusive >= BASE minExclusive */
	    res = xmlSchemaCompareValues(fminexc->val, bfminexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1) {
		xmlSchemaDeriveFacetErr(pctxt, fminexc, bfminexc, 1, 1, 1);
	    }
	    if ((res != 0) && (bfminexc->fixed)) {
		FACET_RESTR_FIXED_ERR(fminexc)
	    }
	}
	if (bfmaxinc) {
	    /* minExclusive <= BASE maxInclusive */
	    res = xmlSchemaCompareValues(fminexc->val, bfmaxinc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == 1) {
		xmlSchemaDeriveFacetErr(pctxt, fminexc, bfmaxinc, -1, 1, 1);
	    }
	}
	if (bfmininc) {
	    /* minExclusive >= BASE minInclusive */
	    res = xmlSchemaCompareValues(fminexc->val, bfmininc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1) {
		xmlSchemaDeriveFacetErr(pctxt, fminexc, bfmininc, 1, 1, 1);
	    }
	}
	if (bfmaxexc) {
	    /* minExclusive < BASE maxExclusive */
	    res = xmlSchemaCompareValues(fminexc->val, bfmaxexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != -1) {
		xmlSchemaDeriveFacetErr(pctxt, fminexc, bfmaxexc, -1, 0, 1);
	    }
	}
    }
    if (fmininc) {
	/*
	* "minInclusive < maxExclusive"
	*/
	if (fmaxexc) {
	    res = xmlSchemaCompareValues(fmininc->val, fmaxexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != -1) {
		xmlSchemaDeriveFacetErr(pctxt, fmininc, fmaxexc, -1, 0, 0);
	    }
	}
	/*
	* "minExclusive valid restriction"
	*/
	if (bfmininc) {
	    /* minInclusive >= BASE minInclusive */
	    res = xmlSchemaCompareValues(fmininc->val, bfmininc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1) {
		xmlSchemaDeriveFacetErr(pctxt, fmininc, bfmininc, 1, 1, 1);
	    }
	    if ((res != 0) && (bfmininc->fixed)) {
		FACET_RESTR_FIXED_ERR(fmininc)
	    }
	}
	if (bfmaxinc) {
	    /* minInclusive <= BASE maxInclusive */
	    res = xmlSchemaCompareValues(fmininc->val, bfmaxinc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == 1) {
		xmlSchemaDeriveFacetErr(pctxt, fmininc, bfmaxinc, -1, 1, 1);
	    }
	}
	if (bfminexc) {
	    /* minInclusive > BASE minExclusive */
	    res = xmlSchemaCompareValues(fmininc->val, bfminexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != 1)
		xmlSchemaDeriveFacetErr(pctxt, fmininc, bfminexc, 1, 0, 1);
	}
	if (bfmaxexc) {
	    /* minInclusive < BASE maxExclusive */
	    res = xmlSchemaCompareValues(fmininc->val, bfmaxexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != -1)
		xmlSchemaDeriveFacetErr(pctxt, fmininc, bfmaxexc, -1, 0, 1);
	}
    }
    if (ftotdig && bftotdig) {
	/*
	* SCC " totalDigits valid restriction"
	* totalDigits <= BASE totalDigits
	*/
	res = xmlSchemaCompareValues(ftotdig->val, bftotdig->val);
	if (res == -2)
	    goto internal_error;
	if (res == 1)
	    xmlSchemaDeriveFacetErr(pctxt, ftotdig, bftotdig,
	    -1, 1, 1);
	if ((res != 0) && (bftotdig->fixed)) {
	    FACET_RESTR_FIXED_ERR(ftotdig)
	}
    }
    if (ffracdig && bffracdig) {
	/*
	* SCC  "fractionDigits valid restriction"
	* fractionDigits <= BASE fractionDigits
	*/
	res = xmlSchemaCompareValues(ffracdig->val, bffracdig->val);
	if (res == -2)
	    goto internal_error;
	if (res == 1)
	    xmlSchemaDeriveFacetErr(pctxt, ffracdig, bffracdig,
	    -1, 1, 1);
	if ((res != 0) && (bffracdig->fixed)) {
	    FACET_RESTR_FIXED_ERR(ffracdig)
	}
    }
    /*
    * SCC "fractionDigits less than or equal to totalDigits"
    */
    if (! ftotdig)
	ftotdig = bftotdig;
    if (! ffracdig)
	ffracdig = bffracdig;
    if (ftotdig && ffracdig) {
	res = xmlSchemaCompareValues(ffracdig->val, ftotdig->val);
	if (res == -2)
	    goto internal_error;
	if (res == 1)
	    xmlSchemaDeriveFacetErr(pctxt, ffracdig, ftotdig,
		-1, 1, 0);
    }
    /*
    * *Enumerations* won' be added here, since only the first set
    * of enumerations in the ancestor-or-self axis is used
    * for validation, plus we need to use the base type of those
    * enumerations for whitespace.
    *
    * *Patterns*: won't be add here, since they are ORed at
    * type level and ANDed at ancestor level. This will
    * happen during validation by walking the base axis
    * of the type.
    */
    for (cur = base->facetSet; cur != NULL; cur = cur->next) {
	bfacet = cur->facet;
	/*
	* Special handling of enumerations and patterns.
	* TODO: hmm, they should not appear in the set, so remove this.
	*/
	if ((bfacet->type == XML_SCHEMA_FACET_PATTERN) ||
	    (bfacet->type == XML_SCHEMA_FACET_ENUMERATION))
	    continue;
	/*
	* Search for a duplicate facet in the current type.
	*/
	link = type->facetSet;
	/* err = 0; */
	/* fixedErr = 0; */
	while (link != NULL) {
	    facet = link->facet;
	    if (facet->type == bfacet->type) {
		switch (facet->type) {
		    case XML_SCHEMA_FACET_WHITESPACE:
			/*
			* The whitespace must be stronger.
			*/
			if (facet->whitespace < bfacet->whitespace) {
			    FACET_RESTR_ERR(facet,
				"The 'whitespace' value has to be equal to "
				"or stronger than the 'whitespace' value of "
				"the base type")
			}
			if ((bfacet->fixed) &&
			    (facet->whitespace != bfacet->whitespace)) {
			    FACET_RESTR_FIXED_ERR(facet)
			}
			break;
		    default:
			break;
		}
		/* Duplicate found. */
		break;
	    }
	    link = link->next;
	}
	/*
	* If no duplicate was found: add the base types's facet
	* to the set.
	*/
	if (link == NULL) {
	    link = (xmlSchemaFacetLinkPtr)
		xmlMalloc(sizeof(xmlSchemaFacetLink));
	    if (link == NULL) {
		xmlSchemaPErrMemory(pctxt,
		    "deriving facets, creating a facet link", NULL);
		return (-1);
	    }
	    link->facet = cur->facet;
	    link->next = NULL;
	    if (last == NULL)
		type->facetSet = link;
	    else
		last->next = link;
	    last = link;
	}

    }

    return (0);
internal_error:
    PERROR_INT("xmlSchemaDeriveAndValidateFacets",
	"an error occurred");
    return (-1);
}